

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterXsYs<int>,_ImPlot::TransformerLogLog>::operator()
          (LineStripRenderer<ImPlot::GetterXsYs<int>,_ImPlot::TransformerLogLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  ImU32 IVar6;
  uint uVar7;
  GetterXsYs<int> *pGVar8;
  TransformerLogLog *pTVar9;
  ImPlotPlot *pIVar10;
  ImDrawVert *pIVar11;
  ImDrawVert *pIVar12;
  uint *puVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [12];
  ImPlotContext *pIVar18;
  int iVar19;
  long lVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  pIVar18 = GImPlot;
  pGVar8 = this->Getter;
  pTVar9 = this->Transformer;
  iVar19 = pGVar8->Count;
  lVar20 = (long)(((pGVar8->Offset + prim + 1) % iVar19 + iVar19) % iVar19) * (long)pGVar8->Stride;
  iVar19 = *(int *)((long)pGVar8->Ys + lVar20);
  dVar14 = log10((double)*(int *)((long)pGVar8->Xs + lVar20) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar10 = pIVar18->CurrentPlot;
  dVar1 = pIVar18->LogDenX;
  dVar2 = (pIVar10->XAxis).Range.Min;
  dVar3 = (pIVar10->XAxis).Range.Max;
  dVar15 = log10((double)iVar19 / pIVar10->YAxis[pTVar9->YAxis].Range.Min);
  iVar19 = pTVar9->YAxis;
  pIVar10 = pIVar18->CurrentPlot;
  auVar25._8_8_ = dVar15;
  auVar25._0_8_ = dVar14;
  auVar26._8_4_ = SUB84(pIVar18->LogDenY[iVar19],0);
  auVar26._0_8_ = dVar1;
  auVar26._12_4_ = (int)((ulong)pIVar18->LogDenY[iVar19] >> 0x20);
  auVar26 = divpd(auVar25,auVar26);
  dVar1 = pIVar10->YAxis[iVar19].Range.Min;
  IVar4 = pIVar18->PixelRange[iVar19].Min;
  fVar21 = (float)(pIVar18->Mx *
                   (((double)(float)auVar26._0_8_ * (dVar3 - dVar2) + dVar2) -
                   (pIVar10->XAxis).Range.Min) + (double)IVar4.x);
  fVar22 = (float)(pIVar18->My[iVar19] *
                   (((double)(float)auVar26._8_8_ * (pIVar10->YAxis[iVar19].Range.Max - dVar1) +
                    dVar1) - dVar1) + (double)IVar4.y);
  fVar23 = (this->P1).x;
  fVar24 = (this->P1).y;
  auVar30._0_4_ = ~-(uint)(fVar21 <= fVar23) & (uint)fVar21;
  auVar30._4_4_ = ~-(uint)(fVar22 <= fVar24) & (uint)fVar22;
  auVar30._8_4_ = ~-(uint)(fVar23 < fVar21) & (uint)fVar21;
  auVar30._12_4_ = ~-(uint)(fVar24 < fVar22) & (uint)fVar22;
  auVar16._4_4_ = (uint)fVar24 & -(uint)(fVar22 <= fVar24);
  auVar16._0_4_ = (uint)fVar23 & -(uint)(fVar21 <= fVar23);
  auVar16._8_4_ = (uint)fVar23 & -(uint)(fVar23 < fVar21);
  auVar16._12_4_ = (uint)fVar24 & -(uint)(fVar24 < fVar22);
  auVar30 = auVar30 | auVar16;
  fVar27 = (cull_rect->Min).y;
  auVar17._4_8_ = auVar30._8_8_;
  auVar17._0_4_ = -(uint)(auVar30._4_4_ < fVar27);
  auVar31._0_8_ = auVar17._0_8_ << 0x20;
  auVar31._8_4_ = -(uint)(auVar30._8_4_ < (cull_rect->Max).x);
  auVar31._12_4_ = -(uint)(auVar30._12_4_ < (cull_rect->Max).y);
  auVar32._4_4_ = -(uint)(fVar27 < auVar30._4_4_);
  auVar32._0_4_ = -(uint)((cull_rect->Min).x < auVar30._0_4_);
  auVar32._8_8_ = auVar31._8_8_;
  iVar19 = movmskps((int)pIVar10,auVar32);
  if (iVar19 == 0xf) {
    IVar6 = this->Col;
    IVar4 = *uv;
    fVar27 = fVar21 - fVar23;
    fVar28 = fVar22 - fVar24;
    fVar29 = fVar27 * fVar27 + fVar28 * fVar28;
    if (0.0 < fVar29) {
      fVar29 = 1.0 / SQRT(fVar29);
      fVar27 = fVar27 * fVar29;
      fVar28 = fVar28 * fVar29;
    }
    fVar29 = this->Weight * 0.5;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->uv = IVar4;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->col = IVar6;
    fVar27 = fVar29 * fVar27;
    fVar29 = fVar29 * fVar28;
    (pIVar11->pos).x = fVar23 + fVar29;
    (pIVar11->pos).y = fVar24 - fVar27;
    pIVar12[1].pos.x = fVar29 + fVar21;
    pIVar12[1].pos.y = fVar22 - fVar27;
    pIVar12[1].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = IVar6;
    pIVar11[2].pos.x = fVar21 - fVar29;
    pIVar11[2].pos.y = fVar27 + fVar22;
    pIVar11[2].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = IVar6;
    IVar5 = this->P1;
    pIVar11[3].pos.x = IVar5.x - fVar29;
    pIVar11[3].pos.y = IVar5.y + fVar27;
    pIVar11[3].uv.x = IVar4.x;
    pIVar11[3].uv.y = IVar4.y;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar11 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    puVar13 = DrawList->_IdxWritePtr;
    *puVar13 = uVar7;
    puVar13[1] = uVar7 + 1;
    puVar13[2] = DrawList->_VtxCurrentIdx + 2;
    uVar7 = DrawList->_VtxCurrentIdx;
    puVar13[3] = uVar7;
    puVar13[4] = uVar7 + 2;
    puVar13[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar13 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  IVar4.y = fVar22;
  IVar4.x = fVar21;
  this->P1 = IVar4;
  return (char)iVar19 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }